

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::truncSatZeroUToI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  long lVar1;
  Literal *pLVar2;
  undefined1 local_d8 [8];
  LaneArray<4___2> lanes;
  LaneArray<4> result;
  Literal local_40;
  
  getLanesF64x2((LaneArray<2> *)local_d8,this);
  lanes._M_elems[1].type.id = 0;
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 0x18) {
    truncSatToUI32(&local_40,(Literal *)(local_d8 + lVar1));
    pLVar2 = (Literal *)((long)&lanes._M_elems[1].type.id + lVar1);
    if (pLVar2 != &local_40) {
      ~Literal(pLVar2);
      Literal(pLVar2,&local_40);
    }
    ~Literal(&local_40);
  }
  for (lVar1 = 0x30; lVar1 != 0x60; lVar1 = lVar1 + 0x18) {
    makeZero(&local_40,
             (Type)lanes._M_elems[0].field_0.gcData.
                   super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    pLVar2 = (Literal *)((long)&lanes._M_elems[1].type.id + lVar1);
    if (pLVar2 != &local_40) {
      ~Literal(pLVar2);
      Literal(pLVar2,&local_40);
    }
    ~Literal(&local_40);
  }
  Literal(__return_storage_ptr__,(LaneArray<4> *)&lanes._M_elems[1].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&lanes._M_elems[1].type);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_d8);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncSatZeroUToI32x4() const {
  return unary_zero<4, &Literal::getLanesF64x2, &Literal::truncSatToUI32>(
    *this);
}